

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O3

complex<long_double> * __thiscall
TPZSkylMatrix<std::complex<long_double>_>::GetVal
          (complex<long_double> *__return_storage_ptr__,
          TPZSkylMatrix<std::complex<long_double>_> *this,int64_t r,int64_t c)

{
  complex<long_double> **ppcVar1;
  complex<long_double> *pcVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  int64_t col;
  int64_t row;
  long lVar6;
  longdouble lVar7;
  longdouble lVar8;
  
  ppcVar1 = (this->fElem).fStore;
  lVar6 = r - c;
  if (lVar6 == 0 || r < c) {
    lVar6 = c - r;
    pcVar2 = ppcVar1[c];
    if (lVar6 < (long)ppcVar1[c + 1] - (long)pcVar2 >> 5) {
      uVar3 = *(undefined8 *)pcVar2[lVar6]._M_value;
      uVar4 = *(undefined8 *)(pcVar2[lVar6]._M_value + 8);
      uVar5 = *(undefined8 *)((long)(pcVar2[lVar6]._M_value + 0x10) + 8);
      *(undefined8 *)(__return_storage_ptr__->_M_value + 0x10) =
           *(undefined8 *)(pcVar2[lVar6]._M_value + 0x10);
      *(undefined8 *)(__return_storage_ptr__->_M_value + 0x18) = uVar5;
      *(undefined8 *)__return_storage_ptr__->_M_value = uVar3;
      *(undefined8 *)(__return_storage_ptr__->_M_value + 8) = uVar4;
      return __return_storage_ptr__;
    }
  }
  else {
    pcVar2 = ppcVar1[r];
    if (lVar6 < (long)ppcVar1[r + 1] - (long)pcVar2 >> 5) {
      lVar7 = *(longdouble *)pcVar2[lVar6]._M_value;
      lVar8 = -*(longdouble *)(pcVar2[lVar6]._M_value + 0x10);
      goto LAB_00cc7e47;
    }
  }
  lVar7 = (longdouble)0;
  lVar8 = lVar7;
LAB_00cc7e47:
  *(longdouble *)__return_storage_ptr__->_M_value = lVar7;
  *(longdouble *)(__return_storage_ptr__->_M_value + 0x10) = lVar8;
  return __return_storage_ptr__;
}

Assistant:

const TVar
TPZSkylMatrix<TVar>::GetVal(const int64_t r,const int64_t c ) const
{
	// inicializando row e col para trabalhar com a triangular superior
	int64_t row(r),col(c);
	if ( row > col ){
		this->Swap( &row, &col );
        const int64_t index   = col - row;
        if ( index < Size(col) ){
            if constexpr (is_complex<TVar>::value){
                return( std::conj(fElem[col][index]) );
            }else{
                return( fElem[col][index] );
            }
        }else{
            return (TVar)0;
        }
    }
	const int64_t index   = col - row;
	if ( index < Size(col) )
		return( fElem[col][index] );
	else {
		return (TVar) 0;
    }

}